

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDependenciesCommand.cxx
# Opt level: O2

bool cmAddDependenciesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  cmMakefile *this;
  pointer pbVar1;
  bool bVar2;
  cmTarget *this_00;
  cmAlphaNum *this_01;
  ulong uVar3;
  string *arg;
  pointer name_00;
  string sStack_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  this_01 = (cmAlphaNum *)&sStack_a8;
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (uVar3 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"called with incorrect number of arguments",
               (allocator<char> *)&local_58);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_01 = &local_88;
  }
  else {
    this = status->Makefile;
    bVar2 = cmMakefile::IsAlias(this,name);
    if (bVar2) {
      local_88.View_._M_len = 0x36;
      local_88.View_._M_str = "Cannot add target-level dependencies to alias target \"";
      local_58.View_._M_str = (name->_M_dataplus)._M_p;
      local_58.View_._M_len = name->_M_string_length;
      cmStrCat<char[4]>(&sStack_a8,&local_88,&local_58,(char (*) [4])0x640383);
      cmMakefile::IssueMessage(this,FATAL_ERROR,&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
    }
    this_00 = cmMakefile::FindTargetToUse(this,name,false);
    if (this_00 != (cmTarget *)0x0) {
      name_00 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      while (name_00 = name_00 + 1, name_00 != pbVar1) {
        cmTarget::AddUtility(this_00,name_00,false,this);
      }
      goto LAB_002bc23d;
    }
    local_88.View_._M_len = 0x3d;
    local_88.View_._M_str = "Cannot add target-level dependencies to non-existent target \"";
    local_58.View_._M_str = (name->_M_dataplus)._M_p;
    local_58.View_._M_len = name->_M_string_length;
    cmStrCat<char[260]>(&sStack_a8,&local_88,&local_58,
                        (char (*) [260])
                        "\".\nThe add_dependencies works for top-level logical targets created by the add_executable, add_library, or add_custom_target commands.  If you want to add file-level dependencies see the DEPENDS option of the add_custom_target and add_custom_command commands."
                       );
    cmMakefile::IssueMessage(this,FATAL_ERROR,&sStack_a8);
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_002bc23d:
  return 0x20 < uVar3;
}

Assistant:

bool cmAddDependenciesCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& target_name = args[0];
  if (mf.IsAlias(target_name)) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot add target-level dependencies to alias target \"",
               target_name, "\".\n"));
  }
  if (cmTarget* target = mf.FindTargetToUse(target_name)) {

    // skip over target_name
    for (std::string const& arg : cmMakeRange(args).advance(1)) {
      target->AddUtility(arg, false, &mf);
    }
  } else {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Cannot add target-level dependencies to non-existent "
        "target \"",
        target_name,
        "\".\nThe add_dependencies works for "
        "top-level logical targets created by the add_executable, "
        "add_library, or add_custom_target commands.  If you want to add "
        "file-level dependencies see the DEPENDS option of the "
        "add_custom_target and add_custom_command commands."));
  }

  return true;
}